

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  cmExtraKateGenerator *this_01;
  allocator local_dc;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  std::__cxx11::string::string
            ((string *)&local_58,(this_00->ProjectName)._M_dataplus._M_p,&local_d9);
  std::__cxx11::string::string((string *)&local_98,"CMAKE_BUILD_TYPE",&local_da);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_98);
  std::__cxx11::string::string((string *)&local_78,pcVar2,&local_db);
  this_01 = (cmExtraKateGenerator *)cmMakefile::GetHomeOutputDirectory(this_00);
  std::__cxx11::string::string((string *)&local_d8,(char *)this_01,&local_dc);
  GetPathBasename(&local_b8,this_01,&local_d8);
  GenerateProjectName(&local_38,this_01,&local_58,&local_78,&local_b8);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[2])
            (&local_38);
  bVar1 = std::operator==(&local_38,"Ninja");
  this->UseNinja = bVar1;
  std::__cxx11::string::~string((string *)&local_38);
  CreateKateProjectFile(this,this_00);
  CreateDummyKateProjectFile(this,this_00);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  const cmMakefile* mf
     = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  this->ProjectName = this->GenerateProjectName(mf->GetProjectName(),
                          mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                          this->GetPathBasename(mf->GetHomeOutputDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(mf);
  this->CreateDummyKateProjectFile(mf);
}